

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::bind_renderbuffer(NegativeTestContext *ctx)

{
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_INVALID_ENUM is generated if target is not GL_RENDERBUFFER.",
             &local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  glu::CallLogWrapper::glBindRenderbuffer(&local_10->super_CallLogWrapper,0xffffffff,0);
  NegativeTestContext::expectError(local_10,0x500);
  glu::CallLogWrapper::glBindRenderbuffer(&local_10->super_CallLogWrapper,0x8d40,0);
  NegativeTestContext::expectError(local_10,0x500);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void bind_renderbuffer (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if target is not GL_RENDERBUFFER.");
	ctx.glBindRenderbuffer(-1, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glBindRenderbuffer(GL_FRAMEBUFFER, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}